

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O1

void __thiscall
bssl::ParseNameTest_RFC2253FormatUnknownOid_Test::TestBody
          (ParseNameTest_RFC2253FormatUnknownOid_Test *this)

{
  internal iVar1;
  pointer *__ptr_1;
  char *message;
  char *in_R9;
  pointer *__ptr;
  Input name_tlv;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  string output;
  RDNSequence rdn;
  uint8_t der [50];
  AssertHelper local_d8;
  Message local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  AssertHelper local_a0;
  string local_98;
  RDNSequence local_78;
  uchar local_58 [64];
  
  local_58[0x20] = '0';
  local_58[0x21] = '\x10';
  local_58[0x22] = '\x06';
  local_58[0x23] = '\b';
  local_58[0x24] = '+';
  local_58[0x25] = '\x06';
  local_58[0x26] = '\x01';
  local_58[0x27] = '\x04';
  local_58[0x28] = '\x01';
  local_58[0x29] = 0x8b;
  local_58[0x2a] = ':';
  local_58[0x2b] = '\0';
  local_58[0x2c] = '\x13';
  local_58[0x2d] = '\x04';
  local_58[0x2e] = '\x04';
  local_58[0x2f] = '\x02';
  local_58[0x10] = '\r';
  local_58[0x11] = '0';
  local_58[0x12] = '\v';
  local_58[0x13] = '\x06';
  local_58[0x14] = '\x03';
  local_58[0x15] = 'U';
  local_58[0x16] = '\x04';
  local_58[0x17] = '\n';
  local_58[0x18] = '\x13';
  local_58[0x19] = '\x04';
  local_58[0x1a] = 'T';
  local_58[0x1b] = 'e';
  local_58[0x1c] = 's';
  local_58[0x1d] = 't';
  local_58[0x1e] = '1';
  local_58[0x1f] = '\x12';
  local_58[0] = '0';
  local_58[1] = '0';
  local_58[2] = '1';
  local_58[3] = '\v';
  local_58[4] = '0';
  local_58[5] = '\t';
  local_58[6] = '\x06';
  local_58[7] = '\x03';
  local_58[8] = 'U';
  local_58[9] = '\x04';
  local_58[10] = '\x06';
  local_58[0xb] = '\x13';
  local_58[0xc] = '\x02';
  local_58[0xd] = 'G';
  local_58[0xe] = 'B';
  local_58[0xf] = '1';
  local_58[0x30] = 'H';
  local_58[0x31] = 'i';
  local_78.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name_tlv.data_.size_ = 0x32;
  name_tlv.data_.data_ = local_58;
  iVar1 = (internal)ParseName(name_tlv,&local_78);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c0[0] = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_c0,(AssertionResult *)"ParseName(rdn_input, &rdn)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x14c,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if ((long *)CONCAT71(local_d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_d0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_d0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
    if (!(bool)iVar1) goto LAB_002866ac;
  }
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  iVar1 = (internal)ConvertToRFC2253(&local_78,&local_98);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar1;
  if ((bool)iVar1) {
LAB_002865f8:
    testing::internal::CmpHelperEQ<char[41],std::__cxx11::string>
              ((internal *)local_c0,"\"1.3.6.1.4.1.1466.0=#04024869,O=Test,C=GB\"","output",
               (char (*) [41])"1.3.6.1.4.1.1466.0=#04024869,O=Test,C=GB",&local_98);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message(&local_d0);
      if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_b8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                 ,0x14f,message);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if ((long *)CONCAT71(local_d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_d0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_d0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c0,(internal *)&local_d0,
               (AssertionResult *)"ConvertToRFC2253(rdn, &output)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x14e,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1);
    }
    if (local_d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_d8.data_ + 8))();
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
    if ((bool)iVar1) goto LAB_002865f8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
LAB_002866ac:
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

TEST(ParseNameTest, RFC2253FormatUnknownOid) {
  const uint8_t der[] = {0x30, 0x30, 0x31, 0x0b, 0x30, 0x09, 0x06, 0x03, 0x55,
                         0x04, 0x06, 0x13, 0x02, 0x47, 0x42, 0x31, 0x0d, 0x30,
                         0x0b, 0x06, 0x03, 0x55, 0x04, 0x0a, 0x13, 0x04, 0x54,
                         0x65, 0x73, 0x74, 0x31, 0x12, 0x30, 0x10, 0x06, 0x08,
                         0x2b, 0x06, 0x01, 0x04, 0x01, 0x8b, 0x3a, 0x00, 0x13,
                         0x04, 0x04, 0x02, 0x48, 0x69};
  der::Input rdn_input(der);
  RDNSequence rdn;
  ASSERT_TRUE(ParseName(rdn_input, &rdn));
  std::string output;
  ASSERT_TRUE(ConvertToRFC2253(rdn, &output));
  ASSERT_EQ("1.3.6.1.4.1.1466.0=#04024869,O=Test,C=GB", output);
}